

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O2

Index __thiscall
wasm::ConstHoisting::getWrittenSize<wasm::LEB<long,signed_char>>
          (ConstHoisting *this,LEB<long,_signed_char> *thing)

{
  Index IVar1;
  undefined1 auStack_28 [8];
  BufferWithRandomAccess buffer;
  
  auStack_28 = (undefined1  [8])0x0;
  buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  BufferWithRandomAccess::operator<<((BufferWithRandomAccess *)auStack_28,(S64LEB)thing->value);
  IVar1 = (int)buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start - auStack_28._0_4_;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_28);
  return IVar1;
}

Assistant:

Index getWrittenSize(const T& thing) {
    BufferWithRandomAccess buffer;
    buffer << thing;
    return buffer.size();
  }